

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocketclient.cpp
# Opt level: O0

void __thiscall session::LoopWrite(session *this)

{
  bool bVar1;
  reference pvVar2;
  shared_ptr<session> *in_RCX;
  enable_shared_from_this<session> local_90;
  code *local_80;
  undefined8 local_78;
  bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
  local_70;
  mutable_buffer local_50 [2];
  undefined1 local_30 [8];
  string WSmessage;
  session *this_local;
  
  WSmessage.field_2._8_8_ = this;
  if ((accepting) ||
     (bVar1 = std::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&requests_abi_cxx11_), !bVar1)) {
    std::__cxx11::string::string((string *)local_30);
    pvVar2 = std::
             queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front(&requests_abi_cxx11_);
    std::__cxx11::string::operator=((string *)local_30,(string *)pvVar2);
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&requests_abi_cxx11_);
    writing = true;
    local_50[0] = (mutable_buffer)
                  boost::asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
    local_80 = on_write;
    local_78 = 0;
    std::enable_shared_from_this<session>::shared_from_this(&local_90);
    boost::beast::
    bind_front_handler<void(session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<session>>
              (&local_70,(beast *)&local_80,(offset_in_session_to_subr *)&local_90,in_RCX);
    boost::beast::websocket::
    stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
    ::
    async_write<boost::asio::mutable_buffers_1,boost::beast::detail::bind_front_wrapper<void(session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<session>>>
              ((stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
                *)&this->ws_,(mutable_buffers_1 *)local_50,&local_70);
    boost::beast::detail::
    bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
    ::~bind_front_wrapper(&local_70);
    std::shared_ptr<session>::~shared_ptr((shared_ptr<session> *)&local_90);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void
session::LoopWrite() {
    if (!accepting && requests.empty()) {
#ifdef DEBUG_PRINT
        std::clog << "Not accepting!" << std::endl;
#endif
        return;
    }

    std::string WSmessage;

    try {
        WSmessage = requests.front();
        requests.pop();
#ifdef DEBUG_PRINT
        std::clog << "> Write \"" << WSmessage << "\"" << std::endl;
#endif
    } catch (...) {
        WSmessage = "";
#ifdef DEBUG_PRINT
        std::clog << "> Write queue is empty" << std::endl;
#endif
    }

    writing = true;

    ws_.async_write(
            net::buffer(WSmessage),
            beast::bind_front_handler(
                    &session::on_write,
                    shared_from_this()));
}